

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  char cVar1;
  ptls_key_schedule_t *ppVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  undefined8 in_RAX;
  uint uVar10;
  uint8_t *puVar11;
  ptls_message_emitter_t *emitter_00;
  size_t sVar12;
  ulong uVar13;
  int ptlslog_include_appdata;
  int includes_appdata;
  ptls_hash_context_t **pppVar14;
  ptls_iovec_t message_00;
  int got_certs;
  undefined8 uStack_38;
  
  puVar11 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar10 = tls->state - PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  if (8 < uVar10) {
switchD_00118207_caseD_a:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x167b,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar1 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_00118207::switchdataD_00134320 +
       (long)(int)(&switchD_00118207::switchdataD_00134320)[uVar10];
  switch(tls->state) {
  default:
    uVar13 = 0x28;
    if (is_end_of_record == 0 || cVar1 != '\x01') goto LAB_00118414;
    uVar10 = server_handle_hello(tls,emitter,message,properties);
    break;
  case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    goto switchD_00118207_caseD_a;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    uVar13 = 10;
    if (cVar1 != '\v') goto LAB_00118414;
    uStack_38 = in_RAX;
    uVar10 = handle_certificate(tls,(uint8_t *)((long)&emitter_00->buf + 4),
                                puVar11 + (long)&emitter_00->buf,(int *)((long)&uStack_38 + 4));
    uVar13 = (ulong)uVar10;
    if (uVar10 != 0) goto LAB_00118414;
    ppVar2 = tls->key_schedule;
    if (ppVar2->num_hashes != 0) {
      pppVar14 = &ppVar2->hashes[0].ctx;
      sVar12 = 0;
      do {
        (*(*pppVar14)->update)(*pppVar14,emitter_00,(size_t)puVar11);
        sVar12 = sVar12 + 1;
        pppVar14 = pppVar14 + 3;
      } while (sVar12 != ppVar2->num_hashes);
    }
    tls->state = (uint)(uStack_38._4_4_ == 0) * 2 + PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
LAB_00118449:
    uVar13 = 0x202;
    goto LAB_00118414;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    uVar13 = 10;
    if (cVar1 != '\x0f') goto LAB_00118414;
    uVar10 = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
    if (uVar10 == 0) {
LAB_00118441:
      tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
      goto LAB_00118449;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0xb8 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1662,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    uVar13 = 10;
    if (cVar1 != '\x05') goto LAB_00118414;
    uVar10 = commission_handshake_secret(tls);
    if (uVar10 == 0) {
      ppVar2 = tls->key_schedule;
      if (ppVar2->num_hashes != 0) {
        pppVar14 = &ppVar2->hashes[0].ctx;
        sVar12 = 0;
        do {
          (*(*pppVar14)->update)(*pppVar14,emitter_00,(size_t)puVar11);
          sVar12 = sVar12 + 1;
          pppVar14 = pppVar14 + 3;
        } while (sVar12 != ppVar2->num_hashes);
      }
      goto LAB_00118441;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    uVar13 = 0x28;
    if (is_end_of_record == 0 || cVar1 != '\x14') goto LAB_00118414;
    uVar10 = verify_finished(tls,message);
    if (uVar10 == 0) {
      puVar3 = (tls->field_19).client.legacy_session_id.base;
      sVar12 = (tls->field_19).client.legacy_session_id.len;
      uVar4 = *(undefined8 *)((long)&tls->field_19 + 0x10);
      uVar5 = *(undefined8 *)((long)&tls->field_19 + 0x18);
      uVar6 = *(undefined8 *)((long)&tls->field_19 + 0x20);
      uVar7 = *(undefined8 *)((long)&tls->field_19 + 0x28);
      uVar8 = *(undefined8 *)((long)&tls->field_19 + 0x38);
      *(ptls_key_exchange_context_t **)((tls->traffic_protection).dec.secret + 0x30) =
           (tls->field_19).client.key_share_ctx;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x38) = uVar8;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x20) = uVar6;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x28) = uVar7;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x10) = uVar4;
      *(undefined8 *)((tls->traffic_protection).dec.secret + 0x18) = uVar5;
      *(uint8_t **)(tls->traffic_protection).dec.secret = puVar3;
      *(size_t *)((tls->traffic_protection).dec.secret + 8) = sVar12;
      (*ptls_clear_memory)(&tls->field_19,0x40);
      uVar10 = setup_traffic_protection(tls,0,(char *)0x0,3,0,0);
      if (uVar10 == 0) {
        ppVar2 = tls->key_schedule;
        if (ppVar2->num_hashes != 0) {
          pppVar14 = &ppVar2->hashes[0].ctx;
          sVar12 = 0;
          do {
            (*(*pppVar14)->update)(*pppVar14,emitter_00,(size_t)puVar11);
            sVar12 = sVar12 + 1;
            pppVar14 = pppVar14 + 3;
          } while (sVar12 != ppVar2->num_hashes);
        }
        tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
        uVar13 = 0;
        goto LAB_00118414;
      }
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    uVar13 = 10;
    if (cVar1 != '\x18') goto LAB_00118414;
    message_00.base = puVar11;
    uVar10 = handle_key_update(tls,emitter_00,message_00);
  }
  uVar13 = (ulong)uVar10;
LAB_00118414:
  if (handle_server_handshake_message::logpoint.state.generation != ptls_log._generation) {
    handle_server_handshake_message_cold_1();
  }
  uVar9 = handle_server_handshake_message::logpoint.state.active_conns;
  if (handle_server_handshake_message::logpoint.state.active_conns != 0) {
    if ((tls->log_state).state.generation != ptls_log._generation) {
      ptls_log__recalc_conn(0,&tls->log_state,ptls_get_server_name,tls);
    }
    if (((tls->log_state).state.active_conns & uVar9) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&handle_server_handshake_message::logpoint,1);
        pushf_logbuf_or_invalidate(",\"tls\":",7,0x15,"%lu",tls);
        pushf_logbuf_or_invalidate(",\"message\":",0xb,0xb,"%u",(ulong)*(byte *)&emitter_00->buf);
        pushf_logbuf_or_invalidate(",\"len\":",7,0x15,"%lu",puVar11 + -4);
        pushf_logbuf_or_invalidate(",\"result\":",10,0xc,"%d",uVar13);
        includes_appdata =
             ptls_log__do_write_end
                       (&handle_server_handshake_message::logpoint,&tls->log_state,
                        ptls_get_server_name,tls,includes_appdata);
      } while (includes_appdata != 0);
    }
  }
  return (int)uVar13;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);
    PTLS_LOG_CONN(receive_message, tls, {
        PTLS_LOG_ELEMENT_UNSIGNED(message, message.base[0]);
        PTLS_LOG_ELEMENT_UNSIGNED(len, message.len - PTLS_HANDSHAKE_HEADER_SIZE);
        PTLS_LOG_ELEMENT_SIGNED(result, ret);
    });

    return ret;
}